

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
* mocker::nasm::getUsedRegs
            (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *__return_storage_ptr__,shared_ptr<mocker::nasm::Inst> *inst)

{
  allocator<std::shared_ptr<mocker::nasm::Register>_> *paVar1;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_00;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_01;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_02;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_03;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_04;
  bool bVar2;
  element_type *this;
  element_type *this_00;
  element_type *peVar3;
  element_type *this_01;
  element_type *peVar4;
  element_type *this_02;
  shared_ptr<mocker::nasm::Addr> *psVar5;
  shared_ptr<mocker::nasm::Register> *psVar6;
  shared_ptr<mocker::nasm::Register> *local_6e0;
  shared_ptr<mocker::nasm::Register> *local_640;
  shared_ptr<mocker::nasm::Register> *local_5c8;
  shared_ptr<mocker::nasm::Register> *local_570;
  shared_ptr<mocker::nasm::Register> *local_508;
  shared_ptr<mocker::nasm::Register> *local_4a0;
  bool local_41a;
  allocator<std::shared_ptr<mocker::nasm::Register>_> local_419;
  shared_ptr<mocker::nasm::Register> *local_418;
  undefined1 local_410 [32];
  shared_ptr<mocker::nasm::Register> local_3f0;
  shared_ptr<mocker::nasm::Register> local_3e0;
  shared_ptr<mocker::nasm::Register> local_3d0;
  shared_ptr<mocker::nasm::Register> local_3c0;
  shared_ptr<mocker::nasm::Register> local_3b0;
  undefined1 local_3a0 [8];
  shared_ptr<mocker::nasm::Ret> p_9;
  allocator<std::shared_ptr<mocker::nasm::Register>_> local_371;
  shared_ptr<mocker::nasm::Register> *local_370;
  undefined1 local_368 [32];
  shared_ptr<mocker::nasm::Register> local_348;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_338;
  undefined1 local_320 [8];
  shared_ptr<mocker::nasm::IDiv> p_8;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_2f8;
  undefined1 local_2e0 [8];
  shared_ptr<mocker::nasm::Cmp> p_7;
  shared_ptr<mocker::nasm::Register> local_2c0;
  shared_ptr<mocker::nasm::Register> local_2b0;
  undefined1 local_2a0 [8];
  shared_ptr<mocker::nasm::Leave> p_6;
  shared_ptr<mocker::nasm::Register> local_280;
  shared_ptr<mocker::nasm::Register> local_270;
  undefined1 local_260 [8];
  shared_ptr<mocker::nasm::Push> p_5;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_238;
  undefined1 local_220 [8];
  shared_ptr<mocker::nasm::BinaryInst> p_4;
  shared_ptr<mocker::nasm::Register> local_200;
  shared_ptr<mocker::nasm::Register> local_1f0;
  undefined1 local_1e0 [8];
  shared_ptr<mocker::nasm::UnaryInst> p_3;
  shared_ptr<mocker::nasm::Lea> p_2;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_1b0;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_198;
  undefined1 local_180 [16];
  shared_ptr<mocker::nasm::Addr> local_170;
  undefined1 local_160 [24];
  undefined1 local_148 [8];
  shared_ptr<mocker::nasm::Mov> p_1;
  undefined1 local_128 [32];
  shared_ptr<mocker::nasm::Register> local_108;
  shared_ptr<mocker::nasm::Register> local_f8;
  shared_ptr<mocker::nasm::Register> local_e8;
  shared_ptr<mocker::nasm::Register> local_d8;
  shared_ptr<mocker::nasm::Register> local_c8;
  undefined1 local_b8 [8];
  shared_ptr<mocker::nasm::Call> p;
  shared_ptr<mocker::nasm::Inst> local_a0;
  byte local_89;
  shared_ptr<mocker::nasm::CJump> local_88;
  byte local_71;
  shared_ptr<mocker::nasm::Cqo> local_70;
  byte local_59;
  shared_ptr<mocker::nasm::Inst> local_58;
  byte local_45;
  shared_ptr<mocker::nasm::Inst> local_38;
  shared_ptr<mocker::nasm::Empty> local_28;
  shared_ptr<mocker::nasm::Inst> *local_18;
  shared_ptr<mocker::nasm::Inst> *inst_local;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *res;
  
  local_18 = inst;
  inst_local = (shared_ptr<mocker::nasm::Inst> *)__return_storage_ptr__;
  dyc<mocker::nasm::Empty,std::shared_ptr<mocker::nasm::Inst>const&>
            ((shared_ptr<mocker::nasm::Inst> *)&local_28);
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_28);
  local_45 = 0;
  local_59 = 0;
  local_71 = 0;
  local_89 = 0;
  p.super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
  local_41a = true;
  if (!bVar2) {
    dyc<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Inst>const&>(&local_38);
    local_45 = 1;
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_38);
    local_41a = true;
    if (!bVar2) {
      dyc<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Inst>const&>(&local_58);
      local_59 = 1;
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_58);
      local_41a = true;
      if (!bVar2) {
        dyc<mocker::nasm::Cqo,std::shared_ptr<mocker::nasm::Inst>const&>
                  ((shared_ptr<mocker::nasm::Inst> *)&local_70);
        local_71 = 1;
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_70);
        local_41a = true;
        if (!bVar2) {
          dyc<mocker::nasm::CJump,std::shared_ptr<mocker::nasm::Inst>const&>
                    ((shared_ptr<mocker::nasm::Inst> *)&local_88);
          local_89 = 1;
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_88);
          local_41a = true;
          if (!bVar2) {
            dyc<mocker::nasm::Set,std::shared_ptr<mocker::nasm::Inst>const&>(&local_a0);
            p.super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _7_1_ = 1;
            local_41a = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_a0);
          }
        }
      }
    }
  }
  if ((p.super___shared_ptr<mocker::nasm::Call,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_
      & 1) != 0) {
    std::shared_ptr<mocker::nasm::Set>::~shared_ptr((shared_ptr<mocker::nasm::Set> *)&local_a0);
  }
  if ((local_89 & 1) != 0) {
    std::shared_ptr<mocker::nasm::CJump>::~shared_ptr(&local_88);
  }
  if ((local_71 & 1) != 0) {
    std::shared_ptr<mocker::nasm::Cqo>::~shared_ptr(&local_70);
  }
  if ((local_59 & 1) != 0) {
    std::shared_ptr<mocker::nasm::Jmp>::~shared_ptr((shared_ptr<mocker::nasm::Jmp> *)&local_58);
  }
  if ((local_45 & 1) != 0) {
    std::shared_ptr<mocker::nasm::Pop>::~shared_ptr((shared_ptr<mocker::nasm::Pop> *)&local_38);
  }
  std::shared_ptr<mocker::nasm::Empty>::~shared_ptr(&local_28);
  if (local_41a == false) {
    dyc<mocker::nasm::Call,std::shared_ptr<mocker::nasm::Inst>const&>
              ((shared_ptr<mocker::nasm::Inst> *)local_b8);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_b8);
    if (bVar2) {
      psVar6 = rdi();
      std::shared_ptr<mocker::nasm::Register>::shared_ptr
                ((shared_ptr<mocker::nasm::Register> *)local_128,psVar6);
      psVar6 = rsi();
      std::shared_ptr<mocker::nasm::Register>::shared_ptr
                ((shared_ptr<mocker::nasm::Register> *)(local_128 + 0x10),psVar6);
      psVar6 = rdx();
      std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_108,psVar6);
      psVar6 = rcx();
      std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_f8,psVar6);
      psVar6 = r8();
      std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_e8,psVar6);
      psVar6 = r9();
      std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_d8,psVar6);
      local_c8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_128;
      local_c8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
      paVar1 = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
               ((long)&p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7);
      std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(paVar1);
      __l_04._M_len =
           (size_type)
           local_c8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      __l_04._M_array =
           (iterator)
           local_c8.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::
      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::vector(__return_storage_ptr__,__l_04,paVar1);
      std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                 ((long)&p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      local_4a0 = &local_c8;
      do {
        local_4a0 = local_4a0 + -1;
        std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_4a0);
      } while (local_4a0 != (shared_ptr<mocker::nasm::Register> *)local_128);
      p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 1;
    }
    else {
      p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
    }
    std::shared_ptr<mocker::nasm::Call>::~shared_ptr((shared_ptr<mocker::nasm::Call> *)local_b8);
    if ((uint)p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi == 0) {
      dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>const&>
                ((shared_ptr<mocker::nasm::Inst> *)local_148);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_148);
      if (bVar2) {
        local_160[0x17] = 0;
        std::__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_148);
        Mov::getOperand((Mov *)local_160);
        getInvolvedRegs(__return_storage_ptr__,(shared_ptr<mocker::nasm::Addr> *)local_160);
        std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Addr> *)local_160);
        std::__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_148);
        Mov::getDest((Mov *)local_180);
        dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const>(&local_170);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_170);
        std::shared_ptr<mocker::nasm::Register>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Register> *)&local_170);
        std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Addr> *)local_180);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          std::__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_148);
          Mov::getDest((Mov *)&p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
          getInvolvedRegs(&local_1b0,
                          (shared_ptr<mocker::nasm::Addr> *)
                          &p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
          anon_unknown_52::merge(&local_198,__return_storage_ptr__,&local_1b0);
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::operator=(__return_storage_ptr__,&local_198);
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::~vector(&local_198);
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::~vector(&local_1b0);
          std::shared_ptr<mocker::nasm::Addr>::~shared_ptr
                    ((shared_ptr<mocker::nasm::Addr> *)
                     &p_2.super___shared_ptr<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 1;
        local_160[0x17] = 1;
      }
      else {
        p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_4_ = 0;
      }
      std::shared_ptr<mocker::nasm::Mov>::~shared_ptr((shared_ptr<mocker::nasm::Mov> *)local_148);
      if ((uint)p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi == 0) {
        dyc<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Inst>const&>
                  ((shared_ptr<mocker::nasm::Inst> *)
                   &p_3.super___shared_ptr<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        bVar2 = std::__shared_ptr::operator_cast_to_bool
                          ((__shared_ptr *)
                           &p_3.
                            super___shared_ptr<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (bVar2) {
          this = std::
                 __shared_ptr_access<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<mocker::nasm::Lea,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&p_3.
                                super___shared_ptr<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
          psVar5 = Lea::getAddr(this);
          getInvolvedRegs(__return_storage_ptr__,psVar5);
        }
        p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _1_3_ = 0;
        p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _0_1_ = bVar2;
        std::shared_ptr<mocker::nasm::Lea>::~shared_ptr
                  ((shared_ptr<mocker::nasm::Lea> *)
                   &p_3.super___shared_ptr<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if ((uint)p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi == 0) {
          dyc<mocker::nasm::UnaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                    ((shared_ptr<mocker::nasm::Inst> *)local_1e0);
          bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1e0);
          if (bVar2) {
            this_00 = std::
                      __shared_ptr_access<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<mocker::nasm::UnaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1e0);
            psVar6 = UnaryInst::getReg(this_00);
            std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_200,psVar6);
            local_1f0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
            paVar1 = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                     ((long)&p_4.
                             super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7);
            local_1f0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)&local_200;
            std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(paVar1);
            __l_03._M_len =
                 (size_type)
                 local_1f0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            __l_03._M_array =
                 (iterator)
                 local_1f0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::vector(__return_storage_ptr__,__l_03,paVar1);
            std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                      ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                       ((long)&p_4.
                               super___shared_ptr<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi + 7));
            local_508 = &local_1f0;
            do {
              local_508 = local_508 + -1;
              std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_508);
            } while (local_508 != &local_200);
            p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _0_4_ = 1;
          }
          else {
            p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _0_4_ = 0;
          }
          std::shared_ptr<mocker::nasm::UnaryInst>::~shared_ptr
                    ((shared_ptr<mocker::nasm::UnaryInst> *)local_1e0);
          if ((uint)p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi == 0) {
            dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                      ((shared_ptr<mocker::nasm::Inst> *)local_220);
            bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_220);
            if (bVar2) {
              peVar3 = std::
                       __shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_220);
              psVar5 = BinaryInst::getLhs(peVar3);
              getInvolvedRegs(&local_238,psVar5);
              peVar3 = std::
                       __shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mocker::nasm::BinaryInst,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_220);
              psVar5 = BinaryInst::getRhs(peVar3);
              getInvolvedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               *)&p_5.
                                  super___shared_ptr<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount,psVar5);
              anon_unknown_52::merge
                        (__return_storage_ptr__,&local_238,
                         (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          *)&p_5.super___shared_ptr<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
              std::
              vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         *)&p_5.super___shared_ptr<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
              std::
              vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::~vector(&local_238);
            }
            p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _1_3_ = 0;
            p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _0_1_ = bVar2;
            std::shared_ptr<mocker::nasm::BinaryInst>::~shared_ptr
                      ((shared_ptr<mocker::nasm::BinaryInst> *)local_220);
            if ((uint)p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi == 0) {
              dyc<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Inst>const&>
                        ((shared_ptr<mocker::nasm::Inst> *)local_260);
              bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_260);
              if (bVar2) {
                this_01 = std::
                          __shared_ptr_access<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<mocker::nasm::Push,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_260);
                psVar6 = Push::getReg(this_01);
                std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_280,psVar6);
                local_270.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
                paVar1 = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                         ((long)&p_6.
                                 super___shared_ptr<mocker::nasm::Leave,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 7);
                local_270.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)&local_280;
                std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(paVar1);
                __l_02._M_len =
                     (size_type)
                     local_270.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
                __l_02._M_array =
                     (iterator)
                     local_270.
                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                std::
                vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ::vector(__return_storage_ptr__,__l_02,paVar1);
                std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                          ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                           ((long)&p_6.
                                   super___shared_ptr<mocker::nasm::Leave,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi + 7));
                local_570 = &local_270;
                do {
                  local_570 = local_570 + -1;
                  std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_570);
                } while (local_570 != &local_280);
                p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._0_4_ = 1;
              }
              else {
                p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi._0_4_ = 0;
              }
              std::shared_ptr<mocker::nasm::Push>::~shared_ptr
                        ((shared_ptr<mocker::nasm::Push> *)local_260);
              if ((uint)p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi == 0) {
                dyc<mocker::nasm::Leave,std::shared_ptr<mocker::nasm::Inst>const&>
                          ((shared_ptr<mocker::nasm::Inst> *)local_2a0);
                bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2a0);
                if (bVar2) {
                  psVar6 = rbp();
                  std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_2c0,psVar6);
                  local_2b0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
                  paVar1 = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                           ((long)&p_7.
                                   super___shared_ptr<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount._M_pi + 7);
                  local_2b0.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)&local_2c0;
                  std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(paVar1);
                  __l_01._M_len =
                       (size_type)
                       local_2b0.
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
                  __l_01._M_array =
                       (iterator)
                       local_2b0.
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  ;
                  std::
                  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ::vector(__return_storage_ptr__,__l_01,paVar1);
                  std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                            ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
                             ((long)&p_7.
                                     super___shared_ptr<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi + 7));
                  local_5c8 = &local_2b0;
                  do {
                    local_5c8 = local_5c8 + -1;
                    std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_5c8);
                  } while (local_5c8 != &local_2c0);
                  p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._0_4_ = 1;
                }
                else {
                  p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._0_4_ = 0;
                }
                std::shared_ptr<mocker::nasm::Leave>::~shared_ptr
                          ((shared_ptr<mocker::nasm::Leave> *)local_2a0);
                if ((uint)p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi == 0) {
                  dyc<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Inst>const&>
                            ((shared_ptr<mocker::nasm::Inst> *)local_2e0);
                  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2e0);
                  if (bVar2) {
                    peVar4 = std::
                             __shared_ptr_access<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_2e0);
                    psVar5 = Cmp::getLhs(peVar4);
                    getInvolvedRegs(&local_2f8,psVar5);
                    peVar4 = std::
                             __shared_ptr_access<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<mocker::nasm::Cmp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_2e0);
                    psVar5 = Cmp::getRhs(peVar4);
                    getInvolvedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                     *)&p_8.
                                        super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount,psVar5);
                    anon_unknown_52::merge
                              (__return_storage_ptr__,&local_2f8,
                               (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                *)&p_8.
                                   super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
                    std::
                    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               *)&p_8.
                                  super___shared_ptr<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                    std::
                    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ::~vector(&local_2f8);
                  }
                  p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._1_3_ = 0;
                  p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._0_1_ = bVar2;
                  std::shared_ptr<mocker::nasm::Cmp>::~shared_ptr
                            ((shared_ptr<mocker::nasm::Cmp> *)local_2e0);
                  if ((uint)p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi == 0) {
                    dyc<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Inst>const&>
                              ((shared_ptr<mocker::nasm::Inst> *)local_320);
                    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_320);
                    if (bVar2) {
                      local_370 = (shared_ptr<mocker::nasm::Register> *)local_368;
                      psVar6 = rax();
                      std::shared_ptr<mocker::nasm::Register>::shared_ptr
                                ((shared_ptr<mocker::nasm::Register> *)local_368,psVar6);
                      local_370 = (shared_ptr<mocker::nasm::Register> *)(local_368 + 0x10);
                      psVar6 = rdx();
                      std::shared_ptr<mocker::nasm::Register>::shared_ptr
                                ((shared_ptr<mocker::nasm::Register> *)(local_368 + 0x10),psVar6);
                      local_348.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           = (element_type *)local_368;
                      local_348.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
                      std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator
                                (&local_371);
                      __l_00._M_len =
                           (size_type)
                           local_348.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
                      __l_00._M_array =
                           (iterator)
                           local_348.
                           super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::vector(&local_338,__l_00,&local_371);
                      this_02 = std::
                                __shared_ptr_access<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<mocker::nasm::IDiv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_320);
                      psVar5 = IDiv::getRhs(this_02);
                      getInvolvedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                       *)&p_9.
                                          super___shared_ptr<mocker::nasm::Ret,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount,psVar5);
                      anon_unknown_52::merge
                                (__return_storage_ptr__,&local_338,
                                 (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                  *)&p_9.
                                     super___shared_ptr<mocker::nasm::Ret,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                 *)&p_9.
                                    super___shared_ptr<mocker::nasm::Ret,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::~vector(&local_338);
                      std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                                (&local_371);
                      local_640 = &local_348;
                      do {
                        local_640 = local_640 + -1;
                        std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_640);
                      } while (local_640 != (shared_ptr<mocker::nasm::Register> *)local_368);
                      p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._0_4_ = 1;
                    }
                    else {
                      p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._0_4_ = 0;
                    }
                    std::shared_ptr<mocker::nasm::IDiv>::~shared_ptr
                              ((shared_ptr<mocker::nasm::IDiv> *)local_320);
                    if ((uint)p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi == 0) {
                      dyc<mocker::nasm::Ret,std::shared_ptr<mocker::nasm::Inst>const&>
                                ((shared_ptr<mocker::nasm::Inst> *)local_3a0);
                      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_3a0);
                      if (bVar2) {
                        local_418 = (shared_ptr<mocker::nasm::Register> *)local_410;
                        psVar6 = rbp();
                        std::shared_ptr<mocker::nasm::Register>::shared_ptr
                                  ((shared_ptr<mocker::nasm::Register> *)local_410,psVar6);
                        local_418 = (shared_ptr<mocker::nasm::Register> *)(local_410 + 0x10);
                        psVar6 = rbx();
                        std::shared_ptr<mocker::nasm::Register>::shared_ptr
                                  ((shared_ptr<mocker::nasm::Register> *)(local_410 + 0x10),psVar6);
                        local_418 = &local_3f0;
                        psVar6 = r12();
                        std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_3f0,psVar6);
                        local_418 = &local_3e0;
                        psVar6 = r13();
                        std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_3e0,psVar6);
                        local_418 = &local_3d0;
                        psVar6 = r14();
                        std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_3d0,psVar6);
                        local_418 = &local_3c0;
                        psVar6 = r15();
                        std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_3c0,psVar6);
                        local_3b0.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr = (element_type *)local_410;
                        local_3b0.
                        super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
                        std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator
                                  (&local_419);
                        __l._M_len = (size_type)
                                     local_3b0.
                                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi;
                        __l._M_array = (iterator)
                                       local_3b0.
                                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr;
                        std::
                        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ::vector(__return_storage_ptr__,__l,&local_419);
                        std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
                                  (&local_419);
                        local_6e0 = &local_3b0;
                        do {
                          local_6e0 = local_6e0 + -1;
                          std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_6e0);
                        } while (local_6e0 != (shared_ptr<mocker::nasm::Register> *)local_410);
                        p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_ = 1;
                      }
                      else {
                        p_1.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi._0_4_ = 0;
                      }
                      std::shared_ptr<mocker::nasm::Ret>::~shared_ptr
                                ((shared_ptr<mocker::nasm::Ret> *)local_3a0);
                      if ((uint)p_1.
                                super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi == 0) {
                        __assert_fail("false",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                                      ,0x5a,
                                      "std::vector<std::shared_ptr<Register>> mocker::nasm::getUsedRegs(const std::shared_ptr<Inst> &)"
                                     );
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<Register>>
getUsedRegs(const std::shared_ptr<Inst> &inst) {
  if (dyc<Empty>(inst) || dyc<Pop>(inst) || dyc<Jmp>(inst) || dyc<Cqo>(inst) ||
      dyc<CJump>(inst) || dyc<Set>(inst))
    return {};

  if (auto p = dyc<Call>(inst)) {
    return {rdi(), rsi(), rdx(), rcx(), r8(), r9()};
  }

  if (auto p = dyc<Mov>(inst)) {
    auto res = getInvolvedRegs(p->getOperand());
    if (!dyc<Register>(p->getDest()))
      res = merge(res, getInvolvedRegs(p->getDest()));
    return res;
  }

  if (auto p = dyc<Lea>(inst)) {
    return getInvolvedRegs(p->getAddr());
  }
  if (auto p = dyc<UnaryInst>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<BinaryInst>(inst)) {
    return merge(getInvolvedRegs(p->getLhs()), getInvolvedRegs(p->getRhs()));
  }
  if (auto p = dyc<Push>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<Leave>(inst)) {
    return {rbp()};
  }
  if (auto p = dyc<Cmp>(inst)) {
    return merge(getInvolvedRegs(p->getLhs()), getInvolvedRegs(p->getRhs()));
  }
  if (auto p = dyc<IDiv>(inst)) {
    return merge({rax(), rdx()}, getInvolvedRegs(p->getRhs()));
  }
  if (auto p = dyc<Ret>(inst)) {
    return {rbp(), rbx(), r12(), r13(), r14(), r15()};
  }
  assert(false);
}